

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O3

void __thiscall amrex::BARef::resize(BARef *this,Long n)

{
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::resize
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)this,n);
  std::
  _Hashtable<amrex::IntVect,_std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<amrex::IntVect>,_amrex::IntVect::shift_hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->hash)._M_h);
  this->has_hashmap = false;
  return;
}

Assistant:

void
BARef::resize (Long n) {
#ifdef AMREX_MEM_PROFILING
    updateMemoryUsage_box(-1);
    updateMemoryUsage_hash(-1);
#endif
    m_abox.resize(n);
    hash.clear();
    has_hashmap = false;
#ifdef AMREX_MEM_PROFILING
    updateMemoryUsage_box(1);
#endif
}